

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

IXML_Node_conflict * ixmlNode_getLastChild(IXML_Node_conflict *nodeptr)

{
  IXML_Node_conflict *pIVar1;
  Nodeptr_conflict *pp_Var2;
  
  if (nodeptr != (IXML_Node_conflict *)0x0) {
    pp_Var2 = &nodeptr->firstChild;
    do {
      pIVar1 = nodeptr;
      nodeptr = *pp_Var2;
      pp_Var2 = &nodeptr->nextSibling;
    } while (nodeptr != (IXML_Node_conflict *)0x0);
    return pIVar1;
  }
  return (IXML_Node_conflict *)0x0;
}

Assistant:

IXML_Node *ixmlNode_getLastChild(IXML_Node *nodeptr)
{
	IXML_Node *prev;
	IXML_Node *next;

	if (nodeptr != NULL) {
		prev = nodeptr;
		next = nodeptr->firstChild;
		while (next != NULL) {
			prev = next;
			next = next->nextSibling;
		}
		return prev;
	} else {
		return NULL;
	}
}